

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

Locations * __thiscall wasm::LazyLocalGraph::getLocations(LazyLocalGraph *this)

{
  bool bVar1;
  map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  *pmVar2;
  LazyLocalGraph *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->locations);
  if (!bVar1) {
    computeLocations(this);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->locations);
    if (!bVar1) {
      __assert_fail("locations",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xe6,"const Locations &wasm::LazyLocalGraph::getLocations() const");
    }
  }
  pmVar2 = std::
           optional<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
           ::operator*(&this->locations);
  return pmVar2;
}

Assistant:

const Locations& getLocations() const {
    if (!locations) {
      computeLocations();
      assert(locations);
    }
    return *locations;
  }